

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QList<QStringView> * __thiscall
QStringView::split(QList<QStringView> *__return_storage_ptr__,QStringView *this,QStringView sep,
                  SplitBehavior behavior,CaseSensitivity cs)

{
  storage_type_conflict *psVar1;
  QStringView haystack0;
  QStringView haystack0_00;
  qsizetype qVar2;
  QList<QStringView> *list;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar1 = this->m_data;
  lVar3 = this->m_size;
  haystack0_00 = *this;
  haystack0 = *this;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QStringView *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar4 = 0;
  qVar2 = QtPrivate::findString(haystack0,0,sep,cs);
  if (qVar2 != -1) {
    lVar4 = 0;
    do {
      if (qVar2 - lVar4 != 0 ||
          (QFlagsStorage<Qt::SplitBehaviorFlags>)
          behavior.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
          super_QFlagsStorage<Qt::SplitBehaviorFlags>.i ==
          (QFlagsStorage<Qt::SplitBehaviorFlags>)0x0) {
        local_48.m_data = psVar1 + lVar4;
        local_48.m_size = qVar2 - lVar4;
        QtPrivate::QPodArrayOps<QStringView>::emplace<QStringView>
                  ((QPodArrayOps<QStringView> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_48);
        QList<QStringView>::end(__return_storage_ptr__);
      }
      lVar4 = qVar2 + sep.m_size;
      qVar2 = QtPrivate::findString(haystack0_00,lVar4 + (ulong)(sep.m_size == 0),sep,cs);
    } while (qVar2 != -1);
  }
  lVar3 = lVar3 - lVar4;
  if ((QFlagsStorage<Qt::SplitBehaviorFlags>)
      behavior.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
      super_QFlagsStorage<Qt::SplitBehaviorFlags>.i == (QFlagsStorage<Qt::SplitBehaviorFlags>)0x0 ||
      lVar3 != 0) {
    local_48.m_data = psVar1 + lVar4;
    local_48.m_size = lVar3;
    QtPrivate::QPodArrayOps<QStringView>::emplace<QStringView>
              ((QPodArrayOps<QStringView> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               &local_48);
    QList<QStringView>::end(__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QStringView> QStringView::split(QStringView sep, Qt::SplitBehavior behavior, Qt::CaseSensitivity cs) const
{
    return splitString<QList<QStringView>>(QStringView(*this), sep, behavior, cs);
}